

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d.c
# Opt level: O0

int parse_at(envy_bios *bios,envy_bios_p *p,int idx,int offset,char **name)

{
  bool bVar1;
  undefined2 local_6c [4];
  uint32_t tblOffset;
  int ret;
  int entries_count;
  p_known_tables *tbls;
  p_known_tables p2_tbls [1];
  p_known_tables *local_38;
  char **local_30;
  char **name_local;
  int offset_local;
  int idx_local;
  envy_bios_p *p_local;
  envy_bios *bios_local;
  
  tbls._0_1_ = 0;
  p2_tbls[0]._0_8_ = &p->falcon_ucode;
  p2_tbls[0].ptr = (uint16_t *)anon_var_dwarf_5b161;
  if (p->bit->version == '\x01') {
    _ret = &local_38;
    tblOffset = 0;
  }
  else {
    if (p->bit->version != '\x02') {
      return -0x16;
    }
    _ret = &tbls;
    tblOffset = 1;
  }
  if ((idx == -1) || (offset == -1)) {
    name_local._4_4_ = idx;
    if (-1 < offset) {
      name_local._4_4_ = 0;
      while( true ) {
        bVar1 = false;
        if (name_local._4_4_ < (int)tblOffset) {
          bVar1 = (uint)*(byte *)(_ret + (long)name_local._4_4_ * 3) != offset;
        }
        if (!bVar1) break;
        name_local._4_4_ = name_local._4_4_ + 1;
      }
    }
    if ((name_local._4_4_ < 0) || ((int)tblOffset <= name_local._4_4_)) {
      bios_local._4_4_ = -2;
    }
    else if (p->bit->t_len < (ushort)(*(byte *)(_ret + (long)name_local._4_4_ * 3) + 2)) {
      bios_local._4_4_ = -2;
    }
    else {
      if (name != (char **)0x0) {
        *name = (char *)_ret[(long)name_local._4_4_ * 3 + 2];
      }
      local_30 = name;
      name_local._0_4_ = offset;
      _offset_local = p;
      p_local = (envy_bios_p *)bios;
      bios_local._4_4_ =
           bios_u32(bios,(uint)p->bit->t_offset + (uint)*(byte *)(_ret + (long)name_local._4_4_ * 3)
                    ,(uint32_t *)local_6c);
      *(undefined2 *)_ret[(long)name_local._4_4_ * 3 + 1] = local_6c[0];
    }
  }
  else {
    bios_local._4_4_ = -0x16;
  }
  return bios_local._4_4_;
}

Assistant:

static int
parse_at(struct envy_bios *bios, unsigned int idx, const char **name)
{
	struct envy_bios_d *d = &bios->d;
	struct d_known_tables tbls[] = {
		{ 0x0, &d->dp_info.offset, "DP INFO" },
	};
	int entries_count = (sizeof(tbls) / sizeof(struct d_known_tables));

	/* check the index */
	if (idx >= entries_count)
		return -ENOENT;

	/* check the table has the right size */
	if (tbls[idx].offset + 2 > d->bit->t_len)
		return -ENOENT;

	if (name)
		*name = tbls[idx].name;

	return bios_u16(bios, d->bit->t_offset + tbls[idx].offset, tbls[idx].ptr);
}